

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp-perf.hpp
# Opt level: O3

string * __thiscall
perf::format_duration_abi_cxx11_(string *__return_storage_ptr__,perf *this,duration *time)

{
  long lVar1;
  ostream *poVar2;
  stringstream strm;
  stringstream asStack_198 [16];
  undefined1 local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  lVar1 = *(long *)this;
  if (lVar1 < 3600000000000) {
    if (lVar1 < 60000000000) {
      if (lVar1 < 10000000000) {
        if (lVar1 < 1000000) {
          if (lVar1 < 1000) {
            poVar2 = std::ostream::_M_insert<long>((long)local_188);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2," ns",3);
            std::__cxx11::stringbuf::str();
          }
          else {
            poVar2 = std::ostream::_M_insert<long>((long)local_188);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,anon_var_dwarf_ceac + 1,4);
            std::__cxx11::stringbuf::str();
          }
        }
        else {
          poVar2 = std::ostream::_M_insert<long>((long)local_188);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," ms",3);
          std::__cxx11::stringbuf::str();
        }
      }
      else {
        poVar2 = std::ostream::_M_insert<long>((long)local_188);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," s",2);
        std::__cxx11::stringbuf::str();
      }
    }
    else {
      poVar2 = std::ostream::_M_insert<long>((long)local_188);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," min",4);
      std::__cxx11::stringbuf::str();
    }
  }
  else {
    poVar2 = std::ostream::_M_insert<long>((long)local_188);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," h",2);
    std::__cxx11::stringbuf::str();
  }
  std::__cxx11::stringstream::~stringstream(asStack_198);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

std::string format_duration(const duration &time)
    {
        std::stringstream strm;

        auto h = std::chrono::duration_cast<hours>(time);
        if (h.count() >= 1l)
        {
            strm << h.count() << " h";
            return strm.str();
        }

        auto m = std::chrono::duration_cast<minutes>(time);
        if (m.count() >= 1l)
        {
            strm << m.count() << " min";
            return strm.str();
        }

        auto s = std::chrono::duration_cast<seconds>(time);
        if (s.count() >= 10l)
        {
            strm << s.count() << " s";
            return strm.str();
        }

        auto ms = std::chrono::duration_cast<milliseconds>(time);
        if (ms.count() >= 1l)
        {
            strm << ms.count() << " ms";
            return strm.str();
        }

        auto mus = std::chrono::duration_cast<microseconds>(time);
        if (mus.count() >= 1l)
        {
            strm << mus.count() << " \u03BCs";
            return strm.str();
        }

        auto ns = std::chrono::duration_cast<nanoseconds>(time);
        strm << ns.count() << " ns";
        return strm.str();
    }